

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O0

void __thiscall
asio::detail::strand_service::
post<tonk::Connection::InitializeIncomingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,unsigned_long,asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_long,tonk::DatagramBuffer)::__0>
          (strand_service *this,implementation_type *impl,type *handler)

{
  completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:158:31)>
  *op;
  undefined8 in_RDI;
  ptr p;
  bool is_continuation;
  undefined1 is_continuation_00;
  type *in_stack_ffffffffffffffb8;
  strand_service *in_stack_ffffffffffffffc0;
  
  is_continuation_00 = (undefined1)((ulong)in_RDI >> 0x38);
  asio_handler_cont_helpers::
  is_continuation<tonk::Connection::InitializeIncomingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,unsigned_long,asio::ip::basic_endpoint<asio::ip::udp>const&,unsigned_long,tonk::DatagramBuffer)::__0>
            ((type *)0x1b1dd6);
  op = completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:158:31)>
       ::ptr::allocate((type *)in_stack_ffffffffffffffc0);
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:158:31)>
  ::completion_handler
            ((completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:158:31)>
              *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  do_post(in_stack_ffffffffffffffc0,(implementation_type *)in_stack_ffffffffffffffb8,
          &op->super_operation,(bool)is_continuation_00);
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:158:31)>
  ::ptr::~ptr((ptr *)0x1b1e55);
  return;
}

Assistant:

void strand_service::post(strand_service::implementation_type& impl,
    Handler& handler)
{
  bool is_continuation =
    asio_handler_cont_helpers::is_continuation(handler);

  // Allocate and construct an operation to wrap the handler.
  typedef completion_handler<Handler> op;
  typename op::ptr p = { asio::detail::addressof(handler),
    op::ptr::allocate(handler), 0 };
  p.p = new (p.v) op(handler);

  ASIO_HANDLER_CREATION((this->context(),
        *p.p, "strand", impl, 0, "post"));

  do_post(impl, p.p, is_continuation);
  p.v = p.p = 0;
}